

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

void __thiscall
ddd::DictionaryMLT<false,_false>::DictionaryMLT
          (DictionaryMLT<false,_false> *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *prefixes)

{
  __uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  __p;
  __uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  local_20;
  
  (this->super_Dictionary)._vptr_Dictionary = (_func_int **)&PTR__DictionaryMLT_0013a978;
  (this->prefix_subtrie_)._M_t.
  super___uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl =
       (DaTrie<false,_false,_true> *)0x0;
  (this->suffix_subtries_).
  super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->suffix_subtries_).
  super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->suffix_subtries_).
  super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->suffix_head_ = 0xffffffff;
  this->num_keys_ = 0;
  make_unique<ddd::DaTrie<false,false,true>,std::vector<char_const*,std::allocator<char_const*>>const&>
            ((ddd *)&local_20,prefixes);
  __p._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl =
       local_20._M_t.
       super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
       .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl =
       (tuple<ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
        )(_Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  ::reset((__uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
           *)&this->prefix_subtrie_,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                   .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl);
  std::
  unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  ::~unique_ptr((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                 *)&local_20);
  return;
}

Assistant:

DictionaryMLT(const std::vector<const char*>& prefixes) {
    prefix_subtrie_ = make_unique<PrefixTrieType>(prefixes);
  }